

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.h
# Opt level: O0

void fidentity8x4_new_sse2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  undefined1 auVar1 [16];
  longlong in_RDX;
  long in_RSI;
  long lVar2;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar3 [16];
  __m128i alVar4;
  __m128i a;
  __m128i b_hi;
  __m128i b_lo;
  __m128i a_hi;
  __m128i a_lo;
  int i;
  __m128i one;
  undefined4 local_cc;
  
  lVar2 = in_RSI;
  for (local_cc = 0; local_cc < 4; local_cc = local_cc + 1) {
    alVar4[1] = lVar2;
    alVar4[0] = 0x16a1;
    alVar4 = scale_round_sse2(alVar4,(int)in_RDX);
    a[1] = lVar2;
    a[0] = 0x16a1;
    alVar4 = scale_round_sse2(a,(int)alVar4[1]);
    in_RDX = alVar4[1];
    auVar1._8_8_ = extraout_XMM0_Qb;
    auVar1._0_8_ = extraout_XMM0_Qa;
    auVar3._8_8_ = extraout_XMM0_Qb_00;
    auVar3._0_8_ = extraout_XMM0_Qa_00;
    auVar3 = packssdw(auVar1,auVar3);
    *(undefined1 (*) [16])(in_RSI + (long)local_cc * 0x10) = auVar3;
  }
  return;
}

Assistant:

static inline void fidentity8x4_new_sse2(const __m128i *const input,
                                         __m128i *const output,
                                         const int8_t cos_bit) {
  (void)cos_bit;
  const __m128i one = _mm_set1_epi16(1);

  for (int i = 0; i < 4; ++i) {
    const __m128i a_lo = _mm_unpacklo_epi16(input[i], one);
    const __m128i a_hi = _mm_unpackhi_epi16(input[i], one);
    const __m128i b_lo = scale_round_sse2(a_lo, NewSqrt2);
    const __m128i b_hi = scale_round_sse2(a_hi, NewSqrt2);
    output[i] = _mm_packs_epi32(b_lo, b_hi);
  }
}